

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_geti(lua_State *L,int idx,lua_Integer n)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  lua_CFunction p_Var4;
  Table *t;
  TValue *key;
  int *piVar5;
  TValue *t_00;
  StkId pTVar6;
  TValue *slot;
  LuaType LVar7;
  char *pcVar8;
  uint ukey;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x2a8,"int lua_geti(lua_State *, int, lua_Integer)");
  }
  t_00 = index2addr(L,idx);
  uVar1 = t_00->tt_;
  if (uVar1 == 0x8005 || (uVar1 & 0xf) != 5) {
    if ((uVar1 & 0xf) == 5) {
      if (uVar1 != 0x8005) {
        pcVar8 = "((((t))->tt_) == (((5) | (1 << 15))))";
LAB_0010e573:
        __assert_fail(pcVar8,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2ab,"int lua_geti(lua_State *, int, lua_Integer)");
      }
      t = (Table *)(t_00->value_).gc;
      if (t->tt != '\x05') {
        pcVar8 = "(((t)->value_).gc)->tt == 5";
        goto LAB_0010e573;
      }
      if (n - 1U < (ulong)t->sizearray) {
        slot = t->array + (n - 1U);
      }
      else {
        slot = luaH_getint(t,n);
      }
      if (slot->tt_ != 0) {
        pTVar6 = L->top;
        pTVar6->value_ = slot->value_;
        uVar1 = slot->tt_;
        pTVar6->tt_ = uVar1;
        if (((short)uVar1 < 0) &&
           (((uVar1 & 0x7f) != (ushort)((pTVar6->value_).gc)->tt ||
            ((L != (lua_State *)0x0 &&
             ((((pTVar6->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x2ac,"int lua_geti(lua_State *, int, lua_Integer)");
        }
        pTVar6 = L->top;
        L->top = pTVar6 + 1;
        if (L->ci->top < pTVar6 + 1) {
          __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x2ad,"int lua_geti(lua_State *, int, lua_Integer)");
        }
        goto LAB_0010e4c5;
      }
    }
    else {
      slot = (TValue *)0x0;
    }
    pTVar6 = L->top;
    (pTVar6->value_).i = n;
    pTVar6->tt_ = 0x13;
    key = L->top;
    L->top = key + 1;
    if (L->ci->top < key + 1) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2b1,"int lua_geti(lua_State *, int, lua_Integer)");
    }
    luaV_finishget(L,t_00,key,key,slot);
    goto LAB_0010e4c5;
  }
  if ((uVar1 != 0x8015) && (uVar1 != 0x8025)) {
    pcVar8 = 
    "(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
    ;
LAB_0010e554:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x2b6,"int lua_geti(lua_State *, int, lua_Integer)");
  }
  p_Var4 = (t_00->value_).f;
  if ((p_Var4[8] != (_func_int_lua_State_ptr)0x15) && (p_Var4[8] != (_func_int_lua_State_ptr)0x25))
  {
    pcVar8 = 
    "((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
    ;
    goto LAB_0010e554;
  }
  uVar3 = *(uint *)(p_Var4 + 0xc);
  if (uVar1 == 0x8025) {
    if ((long)(ulong)(uVar3 - 1) < n) {
LAB_0010e3a5:
      pTVar6 = L->top;
      LVar7 = 0;
    }
    else {
      if (uVar3 <= (uint)n) {
LAB_0010e58b:
        luaG_runerror(L,"array out of bounds");
      }
      pTVar6 = L->top;
      pTVar6->value_ = *(Value *)(*(long *)(p_Var4 + 0x30) + (n & 0xffffffffU) * 8);
      LVar7 = 3;
    }
  }
  else {
    if ((long)(ulong)(uVar3 - 1) < n) goto LAB_0010e3a5;
    if (uVar3 <= (uint)n) goto LAB_0010e58b;
    pTVar6 = L->top;
    pTVar6->value_ = *(Value *)(*(long *)(p_Var4 + 0x30) + (n & 0xffffffffU) * 8);
    LVar7 = 0x13;
  }
  pTVar6->tt_ = LVar7;
  pTVar6 = L->top;
  L->top = pTVar6 + 1;
  if (L->ci->top < pTVar6 + 1) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x2c3,"int lua_geti(lua_State *, int, lua_Integer)");
  }
LAB_0010e4c5:
  piVar5 = *(int **)&L[-1].hookmask;
  *piVar5 = *piVar5 + -1;
  if (*piVar5 == 0) {
    return L->top[-1].tt_ & 0xf;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x2c5,"int lua_geti(lua_State *, int, lua_Integer)");
}

Assistant:

LUA_API int lua_geti (lua_State *L, int idx, lua_Integer n) {
  StkId t;
  const TValue *slot;
  lua_lock(L);
  t = index2addr(L, idx);
  if (ttisLtable(t) || !ttistable(t)) {
    if (luaV_fastgeti(L, t, n, slot)) {
      setobj2s(L, L->top, slot);
      api_incr_top(L);
    }
    else {
      setivalue(L->top, n);
      api_incr_top(L);
      luaV_finishget(L, t, L->top - 1, L->top - 1, slot);
    }
  }
  else {
    RaviArray *h = arrvalue(t);
    if (ttisfarray(t)) {
      if (n <= raviH_getn(h)) { raviH_get_float_inline(L, h, n, L->top); }
      else {
        setnilvalue(L->top);
      }
    }
    else {
      if (n <= raviH_getn(h)) { raviH_get_int_inline(L, h, n, L->top); }
      else {
        setnilvalue(L->top);
      }
    }
    api_incr_top(L);
  }
  lua_unlock(L);
  return ttnov(L->top - 1);
}